

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.h
# Opt level: O1

void __thiscall
ExprHash::Init(ExprHash *this,OpCode opcode,ValueNumber src1Val,ValueNumber src2Val,
              ExprAttributes exprAttributes)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  undefined6 in_register_00000032;
  
  *this = (ExprHash)
          ((src2Val & 0x7ff) << 0x13 | (src1Val & 0x7ff) << 8 |
           (uint)OpCodeToHash[CONCAT62(in_register_00000032,opcode) & 0xffffffff] |
          exprAttributes.attributes << 0x1e);
  if (3 < exprAttributes.attributes) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.h"
                       ,0x3c,"(this->attributes == exprAttributes.Attributes())",
                       "Not enough bits for expr attributes");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if ((((uint)*this >> 8 & 0x7ff) != src1Val) || (((uint)*this >> 0x13 & 0x7ff) != src2Val)) {
    *this = (ExprHash)0x0;
  }
  return;
}

Assistant:

void Init(Js::OpCode opcode, ValueNumber src1Val, ValueNumber src2Val, ExprAttributes exprAttributes)
    {
        extern uint8 OpCodeToHash[(int)Js::OpCode::Count];

        uint32 opCodeHash = OpCodeToHash[(int)opcode];
        this->opcode = opCodeHash;
        this->src1Val = src1Val;
        this->src2Val = src2Val;
        this->attributes = exprAttributes.Attributes();

        // Assert too many opcodes...
        AssertMsg(this->opcode == (uint32)opCodeHash, "Opcode value too large for CSEs");
        AssertMsg(this->attributes == exprAttributes.Attributes(), "Not enough bits for expr attributes");

        // If value numbers are too large, just give up
        if (this->src1Val != src1Val || this->src2Val != src2Val)
        {
            this->opcode = 0;
            this->src1Val = 0;
            this->src2Val = 0;
            this->attributes = 0;
        }
    }